

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC1TL2SLIntraOnly_Test::
~DatarateTestSVC_BasicRateTargetingSVC1TL2SLIntraOnly_Test
          (DatarateTestSVC_BasicRateTargetingSVC1TL2SLIntraOnly_Test *this)

{
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC1TL2SLIntraOnly_Test::
  ~DatarateTestSVC_BasicRateTargetingSVC1TL2SLIntraOnly_Test
            ((DatarateTestSVC_BasicRateTargetingSVC1TL2SLIntraOnly_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC1TL2SLIntraOnly) {
  BasicRateTargetingSVC1TL2SLIntraOnlyTest();
}